

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

string * lightconf::escape_string(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  char utf8 [7];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  sVar4 = 0;
  do {
    if (sVar3 == sVar4) {
      return __return_storage_ptr__;
    }
    bVar1 = pcVar2[sVar4];
    switch(bVar1) {
    case 8:
      break;
    case 9:
      break;
    case 10:
      break;
    case 0xb:
switchD_00115af2_caseD_b:
      if (bVar1 < 0x20 || bVar1 == 0x7f) break;
      std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
      goto LAB_00115b79;
    case 0xc:
      break;
    case 0xd:
      break;
    default:
      if (((bVar1 != 0x22) && (bVar1 != 0x2f)) && (bVar1 != 0x5c)) goto switchD_00115af2_caseD_b;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00115b79:
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

inline std::string escape_string(const std::string& str) {
    const char *table = "0123456789abcdef";
    char utf8[7] = "\\u0000";
    std::string buf;

    for (unsigned char c : str) {
        switch (c) {
        case '\r': buf.append("\\r"); break;
        case '\n': buf.append("\\n"); break;
        case '\\': buf.append("\\\\"); break;
        case '/':  buf.append("\\/"); break;
        case '"':  buf.append("\\\""); break;
        case '\f': buf.append("\\f"); break;
        case '\b': buf.append("\\b"); break;
        case '\t': buf.append("\\t"); break;
        default:
            if (c < 0x20 || c == 0x7f) {
                utf8[4] = table[c >> 4];
                utf8[5] = table[c & 0xf];
                buf.append(utf8);
            } else {
                buf.append(1, c);
            }
        }
    }

    return buf;
}